

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

bool slang::syntax::PortConnectionSyntax::isKind(SyntaxKind kind)

{
  bool bVar1;
  
  bVar1 = true;
  if ((((kind != EmptyPortConnection) && (kind != NamedPortConnection)) &&
      (kind != OrderedPortConnection)) && (kind != WildcardPortConnection)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool PortConnectionSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::EmptyPortConnection:
        case SyntaxKind::NamedPortConnection:
        case SyntaxKind::OrderedPortConnection:
        case SyntaxKind::WildcardPortConnection:
            return true;
        default:
            return false;
    }
}